

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O0

void __thiscall
polyscope::render::backend_openGL3_glfw::GLEngine::applyTransparencySettings(GLEngine *this)

{
  int iVar1;
  long *in_RDI;
  
  iVar1 = *(int *)((long)in_RDI + 0x264);
  if (iVar1 == 0) {
    (**(code **)(*in_RDI + 0x58))(in_RDI,0);
    (**(code **)(*in_RDI + 0x50))(in_RDI,0);
  }
  else if (iVar1 == 1) {
    (**(code **)(*in_RDI + 0x58))(in_RDI,5);
    (**(code **)(*in_RDI + 0x50))(in_RDI,4);
  }
  else if (iVar1 == 2) {
    (**(code **)(*in_RDI + 0x58))(in_RDI,7);
    (**(code **)(*in_RDI + 0x50))(in_RDI,0);
  }
  return;
}

Assistant:

void GLEngine::applyTransparencySettings() {
  // Remove any old transparency-related rules
  switch (transparencyMode) {
  case TransparencyMode::None: {
    setBlendMode(BlendMode::AlphaOver);
    setDepthMode(DepthMode::Less);
    break;
  }
  case TransparencyMode::Simple: {
    setBlendMode(BlendMode::Add);
    setDepthMode(DepthMode::Disable);
    break;
  }
  case TransparencyMode::Pretty: {
    setBlendMode(BlendMode::Disable);
    setDepthMode(DepthMode::Less);
    break;
  }
  }
}